

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# satSolver2.h
# Opt level: O0

int sat_solver2_add_const(sat_solver2 *pSat,int iVar,int fCompl,int fMark,int Id)

{
  int h;
  lit local_24;
  int Cid;
  lit Lits [1];
  int Id_local;
  int fMark_local;
  int fCompl_local;
  int iVar_local;
  sat_solver2 *pSat_local;
  
  Cid = Id;
  Lits[0] = fMark;
  if (-1 < iVar) {
    local_24 = toLitCond(iVar,fCompl);
    h = sat_solver2_addclause(pSat,&local_24,&Cid,Cid);
    if (Lits[0] != 0) {
      clause2_set_partA(pSat,h,1);
    }
    return 1;
  }
  __assert_fail("iVar >= 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bsat/satSolver2.h"
                ,0x10b,"int sat_solver2_add_const(sat_solver2 *, int, int, int, int)");
}

Assistant:

static inline int sat_solver2_add_const( sat_solver2 * pSat, int iVar, int fCompl, int fMark, int Id )
{
    lit Lits[1];
    int Cid;
    assert( iVar >= 0 );

    Lits[0] = toLitCond( iVar, fCompl );
    Cid = sat_solver2_addclause( pSat, Lits, Lits + 1, Id );
    if ( fMark )
        clause2_set_partA( pSat, Cid, 1 );
    return 1;
}